

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int XmlUtf8Encode(int c,char *buf)

{
  int iVar1;
  byte bVar2;
  
  if (c < 0) {
    return 0;
  }
  bVar2 = (byte)c;
  if ((uint)c < 0x80) {
    *buf = bVar2;
    iVar1 = 1;
  }
  else if ((uint)c < 0x800) {
    *buf = (byte)((uint)c >> 6) | 0xc0;
    buf[1] = bVar2 & 0x3f | 0x80;
    iVar1 = 2;
  }
  else {
    if (0xffff < (uint)c) {
      if (0x10ffff < (uint)c) {
        return 0;
      }
      *buf = (byte)((uint)c >> 0x12) | 0xf0;
      buf[1] = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
      buf[2] = (byte)((uint)c >> 6) & 0x3f | 0x80;
      buf[3] = bVar2 & 0x3f | 0x80;
      return 4;
    }
    *buf = (byte)((uint)c >> 0xc) | 0xe0;
    buf[1] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    buf[2] = bVar2 & 0x3f | 0x80;
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int FASTCALL
XmlUtf8Encode(int c, char *buf)
{
  enum {
    /* minN is minimum legal resulting value for N byte sequence */
    min2 = 0x80,
    min3 = 0x800,
    min4 = 0x10000
  };

  if (c < 0)
    return 0;
  if (c < min2) {
    buf[0] = (char)(c | UTF8_cval1);
    return 1;
  }
  if (c < min3) {
    buf[0] = (char)((c >> 6) | UTF8_cval2);
    buf[1] = (char)((c & 0x3f) | 0x80);
    return 2;
  }
  if (c < min4) {
    buf[0] = (char)((c >> 12) | UTF8_cval3);
    buf[1] = (char)(((c >> 6) & 0x3f) | 0x80);
    buf[2] = (char)((c & 0x3f) | 0x80);
    return 3;
  }
  if (c < 0x110000) {
    buf[0] = (char)((c >> 18) | UTF8_cval4);
    buf[1] = (char)(((c >> 12) & 0x3f) | 0x80);
    buf[2] = (char)(((c >> 6) & 0x3f) | 0x80);
    buf[3] = (char)((c & 0x3f) | 0x80);
    return 4;
  }
  return 0;
}